

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_info.cpp
# Opt level: O2

int __thiscall ktx::CommandInfo::main(CommandInfo *this,int argc,char **argv)

{
  allocator<char> local_62;
  allocator<char> local_61;
  string local_60;
  string local_40;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"ktx info",&local_61);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,
             "Prints information about the KTX2 file specified as the input-file argument.\n    The command implicitly calls validate and prints any found errors\n    and warnings to stdout."
             ,&local_62);
  Command::parseCommandLine(&this->super_Command,&local_60,&local_40,argc,argv);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)&local_60);
  executeInfo(this);
  return 0;
}

Assistant:

int CommandInfo::main(int argc, char* argv[]) {
    try {
        parseCommandLine("ktx info",
                "Prints information about the KTX2 file specified as the input-file argument.\n"
                "    The command implicitly calls validate and prints any found errors\n"
                "    and warnings to stdout.",
                argc, argv);
        executeInfo();
        return to_underlying(rc::SUCCESS);
    } catch (const FatalError& error) {
        return +error.returnCode;
    } catch (const std::exception& e) {
        fmt::print(std::cerr, "{} fatal: {}\n", commandName, e.what());
        return +rc::RUNTIME_ERROR;
    }
}